

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  RunResult RVar1;
  unsigned_short *__first;
  unsigned_short *__last;
  unsigned_short local_50 [4];
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  unsigned_short local_22;
  Ptr *pPStack_20;
  L val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v._8_8_ = instr._0_8_;
  pPStack_20 = out_trap;
  out_trap_local = (Ptr *)this;
  RVar1 = Load<unsigned_short>(this,instr,&local_22,out_trap);
  if (RVar1 == Ok) {
    __first = std::begin<unsigned_short,8ul>((unsigned_short (*) [8])local_50);
    __last = std::end<unsigned_short,8ul>((unsigned_short (*) [8])local_50);
    std::fill<unsigned_short*,unsigned_short>(__first,__last,&local_22);
    value.v[4] = result.v[0];
    value.v[5] = result.v[1];
    value.v[6] = result.v[2];
    value.v[7] = result.v[3];
    value.v[0] = local_50[0];
    value.v[1] = local_50[1];
    value.v[2] = local_50[2];
    value.v[3] = local_50[3];
    Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}